

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O0

void ZXing::DataMatrix::C40Encoder::WriteNextTriplet(EncoderContext *context,string *buffer)

{
  ulong in_RSI;
  string *in_stack_00000018;
  EncoderContext *in_stack_00000020;
  
  EncodeToCodewords(in_stack_00000020,in_stack_00000018,context._4_4_);
  std::__cxx11::string::erase(in_RSI,0);
  return;
}

Assistant:

static void WriteNextTriplet(EncoderContext& context, std::string& buffer)
	{
		EncodeToCodewords(context, buffer, 0);
		buffer.erase(0, 3);
	}